

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O1

vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *
dpfb::readKerningPairsGpos
          (vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
           *__return_storage_ptr__,Stream *stream,SfntOffsetTable *sfntOffsetTable,
          KerningParams *params)

{
  ushort uVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *prVar6;
  ushort *puVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  uint16_t value;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lookupIndices;
  LookupContext ctx;
  string local_b0;
  ulong local_90;
  ushort *local_88;
  iterator iStack_80;
  unsigned_short *local_78;
  KerningParams *local_70;
  ushort *local_68;
  vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *local_60;
  long local_58;
  LookupContext local_50;
  
  uVar2 = SfntOffsetTable::getTableOffset(sfntOffsetTable,0x47504f53);
  if (uVar2 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_70 = params;
    (*stream->_vptr_Stream[7])(stream,(ulong)uVar2,0);
    (*stream->_vptr_Stream[5])(stream,&local_b0,2);
    if ((ushort)local_b0._M_dataplus._M_p != 0x100) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                (&local_b0,"Unsupported \"GPOS\" major version %u",
                 (ulong)(ushort)((ushort)local_b0._M_dataplus._M_p << 8 |
                                (ushort)local_b0._M_dataplus._M_p >> 8));
      std::runtime_error::runtime_error(prVar6,(string *)&local_b0);
      *(undefined ***)prVar6 = &PTR__runtime_error_001277e0;
      __cxa_throw(prVar6,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_Stream[7])(stream,2,1);
    (*stream->_vptr_Stream[7])(stream,2,1);
    (*stream->_vptr_Stream[5])(stream,&local_b0,2);
    uVar10 = (ushort)local_b0._M_dataplus._M_p << 8;
    uVar8 = (ushort)local_b0._M_dataplus._M_p >> 8;
    (*stream->_vptr_Stream[5])(stream,&local_b0,2);
    uVar9 = (ushort)local_b0._M_dataplus._M_p;
    local_68 = (ushort *)(ulong)((uVar10 | uVar8) + uVar2);
    local_88 = (ushort *)0x0;
    iStack_80._M_current = (ushort *)0x0;
    local_78 = (unsigned_short *)0x0;
    (*stream->_vptr_Stream[7])(stream,local_68,0);
    local_90 = (ulong)uVar2;
    local_60 = __return_storage_ptr__;
    (*stream->_vptr_Stream[5])(stream,&local_b0,2);
    if ((ushort)local_b0._M_dataplus._M_p != 0) {
      uVar10 = (ushort)local_b0._M_dataplus._M_p << 8 | (ushort)local_b0._M_dataplus._M_p >> 8;
      do {
        (*stream->_vptr_Stream[5])(stream,&local_b0,4);
        iVar3 = (int)local_b0._M_dataplus._M_p;
        (*stream->_vptr_Stream[5])(stream,&local_b0,2);
        if (iVar3 == 0x6e72656b) {
          uVar8 = (ushort)local_b0._M_dataplus._M_p;
          iVar3 = (*stream->_vptr_Stream[8])(stream);
          (*stream->_vptr_Stream[7])
                    (stream,(ulong)((uint)(ushort)(uVar8 << 8 | uVar8 >> 8) + (int)local_68),0);
          (*stream->_vptr_Stream[7])(stream,2,1);
          (*stream->_vptr_Stream[5])(stream,&local_b0,2);
          if ((ushort)local_b0._M_dataplus._M_p != 0) {
            uVar8 = (ushort)local_b0._M_dataplus._M_p << 8 | (ushort)local_b0._M_dataplus._M_p >> 8;
            do {
              (*stream->_vptr_Stream[5])(stream,&local_b0,2);
              local_b0._M_dataplus._M_p._0_4_ =
                   CONCAT22(local_b0._M_dataplus._M_p._2_2_,
                            (ushort)local_b0._M_dataplus._M_p << 8 |
                            (ushort)local_b0._M_dataplus._M_p >> 8);
              _Var5 = std::
                      __find_if<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                                (local_88,iStack_80._M_current,&local_b0);
              if (_Var5._M_current == iStack_80._M_current) {
                if (iStack_80._M_current == local_78) {
                  std::vector<unsigned_short,std::allocator<unsigned_short>>::
                  _M_realloc_insert<unsigned_short_const&>
                            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_88,
                             iStack_80,(unsigned_short *)&local_b0);
                }
                else {
                  *iStack_80._M_current = (ushort)local_b0._M_dataplus._M_p;
                  iStack_80._M_current = iStack_80._M_current + 1;
                }
              }
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
          (*stream->_vptr_Stream[7])(stream,CONCAT44(extraout_var,iVar3),0);
        }
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    local_50.kerningPairs.
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.kerningPairs.
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.kerningPairs.
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50.pxSize = local_70->pxSize;
    local_50.scale = (float)local_50.pxSize / (float)local_70->pxPerEm;
    local_90 = (ulong)((int)local_90 + (uint)(ushort)(uVar9 << 8 | uVar9 >> 8));
    (*stream->_vptr_Stream[7])(stream,local_90,0);
    (*stream->_vptr_Stream[5])(stream,&local_b0,2);
    local_70 = (KerningParams *)iStack_80._M_current;
    if (local_88 != iStack_80._M_current) {
      uVar10 = (ushort)local_b0._M_dataplus._M_p << 8 | (ushort)local_b0._M_dataplus._M_p >> 8;
      local_58 = local_90 + 2;
      puVar7 = local_88;
      do {
        uVar8 = *puVar7;
        local_68 = puVar7;
        if (uVar10 <= uVar8) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          str::format_abi_cxx11_
                    (&local_b0,"Lookup list lookupIdx (%u) >= lookupCount (%u)",(ulong)(uint)uVar8,
                     (ulong)uVar10);
          std::runtime_error::runtime_error(prVar6,(string *)&local_b0);
          *(undefined ***)prVar6 = &PTR__runtime_error_001277e0;
          __cxa_throw(prVar6,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
        }
        (*stream->_vptr_Stream[7])(stream,local_58 + (ulong)(uint)uVar8 * 2,0);
        (*stream->_vptr_Stream[5])(stream,&local_b0,2);
        (*stream->_vptr_Stream[7])
                  (stream,(ulong)((uint)(ushort)((ushort)local_b0._M_dataplus._M_p << 8 |
                                                (ushort)local_b0._M_dataplus._M_p >> 8) +
                                 (int)local_90),0);
        iVar3 = (*stream->_vptr_Stream[8])(stream);
        (*stream->_vptr_Stream[5])(stream,&local_b0,2);
        uVar8 = (ushort)local_b0._M_dataplus._M_p << 8 | (ushort)local_b0._M_dataplus._M_p >> 8;
        if ((uVar8 == 9) || (uVar8 == 2)) {
          (*stream->_vptr_Stream[7])(stream,2,1);
          (*stream->_vptr_Stream[5])(stream,&local_b0,2);
          if ((ushort)local_b0._M_dataplus._M_p != 0) {
            uVar9 = (ushort)local_b0._M_dataplus._M_p << 8 | (ushort)local_b0._M_dataplus._M_p >> 8;
            do {
              (*stream->_vptr_Stream[5])(stream,&local_b0,2);
              uVar1 = (ushort)local_b0._M_dataplus._M_p;
              iVar4 = (*stream->_vptr_Stream[8])(stream);
              (*stream->_vptr_Stream[7])
                        (stream,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8) +
                                CONCAT44(extraout_var_00,iVar3),0);
              readGposSubtable(stream,&local_50,(uint)uVar8);
              (*stream->_vptr_Stream[7])(stream,CONCAT44(extraout_var_01,iVar4),0);
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
        }
        puVar7 = local_68 + 1;
      } while ((KerningParams *)puVar7 != local_70);
    }
    __return_storage_ptr__ = local_60;
    (local_60->super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_50.kerningPairs.
         super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_60->super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_50.kerningPairs.
         super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_60->super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_50.kerningPairs.
         super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_50.kerningPairs.
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.kerningPairs.
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.kerningPairs.
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_88 != (ushort *)0x0) {
      operator_delete(local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RawKerningPair> readKerningPairsGpos(
    Stream& stream,
    const SfntOffsetTable& sfntOffsetTable,
    const KerningParams& params)
{
    const auto tableOffset = sfntOffsetTable.getTableOffset(
        sfntTag('G', 'P', 'O', 'S'));
    if (tableOffset == 0)
        return {};

    stream.seek(tableOffset, SeekOrigin::set);

    const auto versionMajor = stream.readU16Be();
    if (versionMajor != 1)
        throw StreamError(str::format(
            "Unsupported \"GPOS\" major version %" PRIu16,
            versionMajor));
    // Skip minor version
    stream.seek(sizeof(std::uint16_t), SeekOrigin::cur);

    // Skip scriptListOffset
    stream.seek(sizeof(std::uint16_t), SeekOrigin::cur);
    const auto featureListOffset = stream.readU16Be();
    const auto lookupListOffset = stream.readU16Be();

    const auto lookupIndices = getAllKernFeatures(
        stream, tableOffset + featureListOffset);

    LookupContext ctx;
    ctx.pxSize = params.pxSize;
    ctx.scale = getScale(params);
    lookupFeatures(
        stream, tableOffset + lookupListOffset, ctx, lookupIndices);

    return std::move(ctx.kerningPairs);
}